

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeInternalForces
          (ChElementShellANCF_3423 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_8,_3> *d;
  undefined8 *puVar1;
  long lVar2;
  pointer pMVar3;
  pointer pdVar4;
  double *pdVar5;
  pointer pMVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  ChLog *this_00;
  ChStreamOutAscii *pCVar11;
  ulong uVar12;
  ulong uVar13;
  uint unVal;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  ChVectorN<double,_5> alphaEAS;
  ShellANCF_Force formula;
  ChVectorN<double,_5> sol;
  ChVectorN<double,_5> HE;
  ChVectorN<double,_54> result;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  double local_680;
  ChVectorDynamic<> *local_660;
  long local_658;
  double local_650;
  double local_648;
  ChIntegrable3D<Eigen::Matrix<double,_54,_1,_0,_54,_1>_> local_640;
  ChElementShellANCF_3423 *local_638;
  ulong local_630;
  undefined1 *local_628;
  double local_620;
  double dStack_618;
  double local_610;
  double dStack_608;
  double local_600;
  double dStack_5f8;
  double local_5f0;
  double dStack_5e8;
  double local_5e0;
  double dStack_5d8;
  double local_5d0;
  double dStack_5c8;
  double local_5c0;
  double dStack_5b8;
  double local_5b0;
  double dStack_5a8;
  double local_5a0;
  double dStack_598;
  double local_590;
  double dStack_588;
  double local_580;
  double dStack_578;
  double local_570;
  double dStack_568;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  double local_540;
  Matrix<double,_5,_1,_0,_5,_1> local_530;
  Matrix<double,_54,_1,_0,_54,_1> local_500;
  undefined1 local_340 [256];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  plain_array<double,_5,_1,_0> local_1c0;
  bool bStack_198;
  bool bStack_197;
  undefined1 auStack_196 [22];
  undefined1 local_180 [64];
  double local_140;
  double dStack_138;
  double dStack_130;
  double dStack_128;
  double dStack_120;
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double dStack_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  
  d = &this->m_d;
  CalcCoordMatrix(this,d);
  CalcCoordDerivMatrix(this,&this->m_d_dt);
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.array[0]
       = (double)d;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.array[1]
       = (double)d;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,8,8,0,8,8>>
            ((Matrix<double,_8,_8,_0,_8,_8> *)local_340,d,
             (Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_> *)
             (local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
              m_data.array + 1));
  auVar14._8_8_ = local_340._8_8_;
  auVar14._0_8_ = local_340._0_8_;
  auVar14._16_8_ = local_340._16_8_;
  auVar14._24_8_ = local_340._24_8_;
  auVar14._32_8_ = local_340._32_8_;
  auVar14._40_8_ = local_340._40_8_;
  auVar14._48_8_ = local_340._48_8_;
  auVar14._56_8_ = local_340._56_8_;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x28c0) + ZEXT3264(_DAT_009a4280),0xffff,auVar14);
  auVar7._8_8_ = local_340._72_8_;
  auVar7._0_8_ = local_340._64_8_;
  auVar7._16_8_ = local_340._80_8_;
  auVar7._24_8_ = local_340._88_8_;
  auVar7._32_8_ = local_340._96_8_;
  auVar7._40_8_ = local_340._104_8_;
  auVar7._48_8_ = local_340._112_8_;
  auVar7._56_8_ = local_340._120_8_;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x28c8) + ZEXT3264(_DAT_009a4280),0xffff,auVar7);
  auVar8._8_8_ = local_340._136_8_;
  auVar8._0_8_ = local_340._128_8_;
  auVar8._16_8_ = local_340._144_8_;
  auVar8._24_8_ = local_340._152_8_;
  auVar8._32_8_ = local_340._160_8_;
  auVar8._40_8_ = local_340._168_8_;
  auVar8._48_8_ = local_340._176_8_;
  auVar8._56_8_ = local_340._184_8_;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x28c0) + ZEXT3264(_DAT_009a42c0),0xffff,auVar8);
  auVar9._8_56_ = local_340._200_56_;
  auVar9._0_8_ = local_340._192_8_;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x28c0) + ZEXT3264(_DAT_009a42e0),0xffff,auVar9);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x28c0) + ZEXT3264(_DAT_009a4300),0xffff,local_240);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x28c0) + ZEXT3264(_DAT_009a4320),0xffff,local_200);
  auVar10[0x28] = bStack_198;
  auVar10._0_8_ = local_1c0.array[0];
  auVar10._8_8_ = local_1c0.array[1];
  auVar10._16_8_ = local_1c0.array[2];
  auVar10._24_8_ = local_1c0.array[3];
  auVar10._32_8_ = local_1c0.array[4];
  auVar10[0x29] = bStack_197;
  auVar10._42_22_ = auStack_196;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x28c0) + ZEXT3264(_DAT_009a4340),0xffff,auVar10);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x28c0) + ZEXT3264(_DAT_009a4360),0xffff,local_180);
  CalcStrainANSbilinearShell(this);
  lVar2 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar2 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar2 != 0) {
    memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar2 << 3);
  }
  if (this->m_numLayers != 0) {
    uVar13 = 0;
    local_660 = Fi;
    do {
      pMVar3 = (this->m_alphaEAS).
               super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_658 = uVar13 * 5;
      unVal = 0;
      local_680 = *(double *)
                   ((long)&pMVar3[uVar13].
                           super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data + 0x20);
      pMVar3 = pMVar3 + uVar13;
      local_6a0 = *(undefined1 (*) [16])
                   &(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage
                    .m_data;
      auStack_690 = *(undefined1 (*) [16])
                     ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).
                             m_storage.m_data + 0x10);
      do {
        local_628 = local_6a0;
        local_640._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b37848;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x30] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x31] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x32] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x33] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x34] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x35] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x28] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x29] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2a] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2b] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2c] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2d] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2e] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2f] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x20] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x21] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x22] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x23] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x24] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x25] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x26] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x27] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x18] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x19] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1a] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1b] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1c] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1d] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1e] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1f] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x10] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x11] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x12] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x13] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x14] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x15] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x16] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x17] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[8] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[9] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[10] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xb] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xd] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xe] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xf] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[1] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[2] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[3] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[4] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[5] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[6] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[7] = 0.0;
        pdVar4 = (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_638 = this;
        local_630 = uVar13;
        ChQuadrature::Integrate3D<Eigen::Matrix<double,54,1,0,54,1>>
                  (&local_500,&local_640,-1.0,1.0,-1.0,1.0,pdVar4[uVar13],pdVar4[uVar13 + 1],2);
        local_530.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[0] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x18];
        local_530.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[1] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x19];
        local_530.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[2] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1a];
        local_530.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[3] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1b];
        local_530.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[4] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1c];
        auVar15._8_8_ = 0;
        auVar15._0_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1c] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1c] +
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x18] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x18] +
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1a] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1a] +
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x19] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x19] +
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1b] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1b];
        auVar15 = vsqrtsd_avx(auVar15,auVar15);
        if (auVar15._0_8_ < 1e-05) {
          local_340._64_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[8];
          local_340._72_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[9];
          local_340._80_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[10];
          local_340._88_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0xb];
          local_340._96_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0xc];
          local_340._104_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0xd];
          local_340._112_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0xe];
          local_340._120_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0xf];
          local_340._128_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0x10];
          local_340._136_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0x11];
          local_340._144_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0x12];
          local_340._152_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0x13];
          local_340._160_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0x14];
          local_340._168_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0x15];
          local_340._176_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0x16];
          local_340._184_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0x17];
          local_340._0_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[0];
          local_340._8_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[1];
          local_340._16_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[2];
          local_340._24_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[3];
          local_340._32_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[4];
          local_340._40_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[5];
          local_340._48_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[6];
          local_340._56_8_ =
               local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
               m_data.array[7];
          dVar40 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x35];
          dVar16 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1d];
          dVar17 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1e];
          dVar18 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1f];
          dVar19 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x20];
          dVar20 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x21];
          dVar21 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x22];
          dVar22 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x23];
          dVar23 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x24];
          dVar24 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x25];
          dVar25 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x26];
          dVar26 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x27];
          dVar27 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x28];
          dVar28 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x29];
          dVar29 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2a];
          dVar30 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2b];
          dVar31 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2c];
          dVar32 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2d];
          dVar33 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2e];
          dVar34 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2f];
          dVar35 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x30];
          dVar36 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x31];
          dVar37 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x32];
          dVar38 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x33];
          dVar39 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x34];
          goto LAB_00731f69;
        }
        bStack_198 = false;
        bStack_197 = false;
        local_340._0_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1d];
        local_340._8_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1e];
        local_340._16_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1f];
        local_340._24_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x20];
        local_340._32_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x21];
        local_340._40_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x22];
        local_340._48_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x23];
        local_340._56_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x24];
        local_340._64_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x25];
        local_340._72_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x26];
        local_340._80_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x27];
        local_340._88_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x28];
        local_340._96_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x29];
        local_340._104_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2a];
        local_340._112_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2b];
        local_340._120_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2c];
        local_340._128_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2d];
        local_340._136_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2e];
        local_340._144_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2f];
        local_340._152_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x30];
        local_340._160_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x31];
        local_340._168_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x32];
        local_340._176_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x33];
        local_340._184_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x34];
        local_140 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[8];
        dStack_138 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[9];
        dStack_130 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[10];
        dStack_128 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xb];
        dStack_120 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xc];
        dStack_118 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xd];
        dStack_110 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xe];
        dStack_108 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xf];
        local_100 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x10];
        dStack_f8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x11];
        dStack_f0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x12];
        dStack_e8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x13];
        dStack_e0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x14];
        dStack_d8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x15];
        dStack_d0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x16];
        dStack_c8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x17];
        local_c0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0];
        dStack_b8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[1];
        dStack_b0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[2];
        dStack_a8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[3];
        dStack_a0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[4];
        dStack_98 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[5];
        dStack_90 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[6];
        dStack_88 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[7];
        local_570 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x1d];
        dStack_568 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x1e];
        local_580 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x1f];
        dStack_578 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x20];
        local_590 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x21];
        dStack_588 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x22];
        local_5a0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x23];
        dStack_598 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x24];
        local_5b0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x25];
        dStack_5a8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x26];
        local_5c0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x27];
        dStack_5b8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x28];
        local_5d0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x29];
        dStack_5c8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x2a];
        local_5e0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x2b];
        dStack_5d8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x2c];
        local_5f0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x2d];
        dStack_5e8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x2e];
        local_600 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x2f];
        dStack_5f8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x30];
        local_610 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x31];
        dStack_608 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x32];
        local_620 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x33];
        dStack_618 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x34];
        local_650 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x35];
        local_340._192_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x35];
        local_648 = auVar15._0_8_;
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>::computeInPlace
                  ((ColPivHouseholderQR<Eigen::Matrix<double,_5,_5,_1,_5,_5>_> *)local_340);
        if (bStack_198 == false) {
          __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                        "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                        "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 5, 5, 1>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 5, 5, 1>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Matrix<double, 5, 1, 0, 5, 1>>]"
                       );
        }
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>>::
        _solve_impl<Eigen::Matrix<double,5,1,0,5,1>,Eigen::Matrix<double,5,1,0,5,1>>
                  ((ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>> *)local_340,&local_530,
                   (Matrix<double,_5,_1,_0,_5,_1> *)local_560);
        local_6a0 = vsubpd_avx(local_6a0,local_560);
        auStack_690 = vsubpd_avx(auStack_690,local_550);
        local_680 = local_680 - local_540;
        if (1 < unVal) {
          this_00 = GetLog();
          pCVar11 = ChStreamOutAscii::operator<<(&this_00->super_ChStreamOutAscii,"  count ");
          pCVar11 = ChStreamOutAscii::operator<<(pCVar11,unVal);
          pCVar11 = ChStreamOutAscii::operator<<(pCVar11,"  NormHE ");
          pCVar11 = ChStreamOutAscii::operator<<(pCVar11,local_648);
          ChStreamOutAscii::operator<<(pCVar11,"\n");
        }
        unVal = unVal + 1;
      } while (unVal != 100);
      local_340._64_8_ = local_140;
      local_340._72_8_ = dStack_138;
      local_340._80_8_ = dStack_130;
      local_340._88_8_ = dStack_128;
      local_340._96_8_ = dStack_120;
      local_340._104_8_ = dStack_118;
      local_340._112_8_ = dStack_110;
      local_340._120_8_ = dStack_108;
      local_340._128_8_ = local_100;
      local_340._136_8_ = dStack_f8;
      local_340._144_8_ = dStack_f0;
      local_340._152_8_ = dStack_e8;
      local_340._160_8_ = dStack_e0;
      local_340._168_8_ = dStack_d8;
      local_340._176_8_ = dStack_d0;
      local_340._184_8_ = dStack_c8;
      local_340._0_8_ = local_c0;
      local_340._8_8_ = dStack_b8;
      local_340._16_8_ = dStack_b0;
      local_340._24_8_ = dStack_a8;
      local_340._32_8_ = dStack_a0;
      local_340._40_8_ = dStack_98;
      local_340._48_8_ = dStack_90;
      local_340._56_8_ = dStack_88;
      dVar40 = local_650;
      dVar16 = local_570;
      dVar17 = dStack_568;
      dVar18 = local_580;
      dVar19 = dStack_578;
      dVar20 = local_590;
      dVar21 = dStack_588;
      dVar22 = local_5a0;
      dVar23 = dStack_598;
      dVar24 = local_5b0;
      dVar25 = dStack_5a8;
      dVar26 = local_5c0;
      dVar27 = dStack_5b8;
      dVar28 = local_5d0;
      dVar29 = dStack_5c8;
      dVar30 = local_5e0;
      dVar31 = dStack_5d8;
      dVar32 = local_5f0;
      dVar33 = dStack_5e8;
      dVar34 = local_600;
      dVar35 = dStack_5f8;
      dVar36 = local_610;
      dVar37 = dStack_608;
      dVar38 = local_620;
      dVar39 = dStack_618;
LAB_00731f69:
      if ((local_660->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows != 0x18) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, 24, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
                     );
      }
      pdVar5 = (local_660->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      uVar12 = 0xfffffffffffffff8;
      do {
        auVar14 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar5 + uVar12 + 8),
                                 *(undefined1 (*) [64])(local_340 + uVar12 * 8 + 0x40));
        *(undefined1 (*) [64])(pdVar5 + uVar12 + 8) = auVar14;
        uVar12 = uVar12 + 8;
      } while (uVar12 < 0x10);
      pMVar3 = (this->m_alphaEAS).
               super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).
                       m_storage.m_data + local_658 * 8);
      *puVar1 = local_6a0._0_8_;
      puVar1[1] = local_6a0._8_8_;
      puVar1 = (undefined8 *)
               ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).
                       m_storage.m_data + local_658 * 8 + 0x10);
      *puVar1 = auStack_690._0_8_;
      puVar1[1] = auStack_690._8_8_;
      *(double *)
       ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
               m_data + local_658 * 8 + 0x20) = local_680;
      uVar12 = uVar13 + 1;
      pMVar6 = (this->m_KalphaEAS).
               super__Vector_base<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.m_storage.m_data.
      array[0] = dVar16;
      *(double *)
       ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.m_storage
               .m_data + 8) = dVar17;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x10);
      *pdVar5 = dVar18;
      pdVar5[1] = dVar19;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x20);
      *pdVar5 = dVar20;
      pdVar5[1] = dVar21;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x30);
      *pdVar5 = dVar22;
      pdVar5[1] = dVar23;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x40);
      *pdVar5 = dVar24;
      pdVar5[1] = dVar25;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x50);
      *pdVar5 = dVar26;
      pdVar5[1] = dVar27;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x60);
      *pdVar5 = dVar28;
      pdVar5[1] = dVar29;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x70);
      *pdVar5 = dVar30;
      pdVar5[1] = dVar31;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x80);
      *pdVar5 = dVar32;
      pdVar5[1] = dVar33;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x90);
      *pdVar5 = dVar34;
      pdVar5[1] = dVar35;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0xa0);
      *pdVar5 = dVar36;
      pdVar5[1] = dVar37;
      pdVar5 = (double *)
               ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0xb0);
      *pdVar5 = dVar38;
      pdVar5[1] = dVar39;
      *(double *)
       ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.m_storage
               .m_data + 0xc0) = dVar40;
      uVar13 = uVar12;
    } while (uVar12 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    // Current nodal coordinates and velocities
    CalcCoordMatrix(m_d);
    CalcCoordDerivMatrix(m_d_dt);
    m_ddT = m_d * m_d.transpose();
    // Assumed Natural Strain (ANS):  Calculate m_strainANS and m_strainANS_D
    CalcStrainANSbilinearShell();

    Fi.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        ChVectorN<double, 24> Finternal;
        ChVectorN<double, 5> HE;
        ChMatrixNM<double, 5, 5> KALPHA;

        // Initial guess for EAS parameters
        ChVectorN<double, 5> alphaEAS = m_alphaEAS[kl];

        // Newton loop for EAS
        for (int count = 0; count < m_maxIterationsEAS; count++) {
            ShellANCF_Force formula(this, kl, &alphaEAS);
            ChVectorN<double, 54> result;
            result.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 54>>(result,                          // result of integration
                                                             formula,                         // integrand formula
                                                             -1, 1,                           // x limits
                                                             -1, 1,                           // y limits
                                                             m_GaussZ[kl], m_GaussZ[kl + 1],  // z limits
                                                             2                                // order of integration
            );

            // Extract vectors and matrices from result of integration
            Finternal = result.segment(0, 24);
            HE = result.segment(24, 5);
            KALPHA = Eigen::Map<ChMatrixNM<double, 5, 5>>(result.segment(29, 5 * 5).data(), 5, 5);

            // Check convergence (residual check)
            double norm_HE = HE.norm();
            if (norm_HE < m_toleranceEAS)
                break;

            // Calculate increment and update EAS parameters
            ChVectorN<double, 5> sol = KALPHA.colPivHouseholderQr().solve(HE);
            alphaEAS -= sol;

            if (count >= 2)
                GetLog() << "  count " << count << "  NormHE " << norm_HE << "\n";
        }

        // Accumulate internal force
        Fi -= Finternal;

        // Cache alphaEAS and KALPHA for use in Jacobian calculation
        m_alphaEAS[kl] = alphaEAS;
        m_KalphaEAS[kl] = KALPHA;

    }  // Layer Loop
}